

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfCase.cpp
# Opt level: O0

IfCase * __thiscall ninx::parser::element::IfCase::clone_impl(IfCase *this)

{
  IfCase *this_00;
  ASTElement local_30;
  Block *local_10;
  IfCase *this_local;
  
  local_10 = (Block *)this;
  this_00 = (IfCase *)operator_new(0x28);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::operator->(&this->condition);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&stack0xffffffffffffffe8);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::operator->(&this->body);
  ASTElement::clone<ninx::parser::element::Block>(&local_30);
  IfCase(this_00,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&stack0xffffffffffffffe8,
         (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
          *)&local_30);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&stack0xffffffffffffffe8);
  return this_00;
}

Assistant:

ninx::parser::element::IfCase *ninx::parser::element::IfCase::clone_impl() {
    return new IfCase(this->condition->clone<Expression>(), this->body->clone<Block>());
}